

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_ptr_tests.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3889::StatePointer_SetStateOutOfBounds_Test::TestBody
          (StatePointer_SetStateOutOfBounds_Test *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *message;
  AssertHelper local_120;
  Message local_118;
  int local_10c;
  exception *gtest_exception;
  ReturnSentinel gtest_sentinel;
  scoped_ptr<testing::internal::DeathTest> gtest_dt_ptr;
  DeathTest *local_c0;
  DeathTest *gtest_dt;
  RE *local_28;
  RE *gtest_regex;
  state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> p;
  Foo foo;
  StatePointer_SetStateOutOfBounds_Test *this_local;
  
  putl::state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL>::state_ptr
            ((state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> *)&gtest_regex,
             (pointer_type)((long)&p.m_ptr_and_state + 4),0);
  bVar1 = testing::internal::AlwaysTrue();
  if (!bVar1) goto LAB_0014e0a3;
  testing::internal::RE::RE((RE *)&gtest_dt,"state value is out of bounds for this state_ptr");
  local_28 = (RE *)&gtest_dt;
  bVar1 = testing::internal::DeathTest::Create
                    ("p.set_state(1337)",(RE *)&gtest_dt,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Robbepop[P]state_ptr/testsrc/state_ptr_tests.cpp"
                     ,0x3f,&local_c0);
  if (bVar1) {
    if (local_c0 != (DeathTest *)0x0) {
      testing::internal::scoped_ptr<testing::internal::DeathTest>::scoped_ptr
                ((scoped_ptr<testing::internal::DeathTest> *)&gtest_sentinel,local_c0);
      iVar2 = (*local_c0->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_c0->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_c0->_vptr_DeathTest[4])(local_c0,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_0014e035;
        local_10c = 2;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception,local_c0);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            putl::state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL>::set_state
                      ((state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> *)&gtest_regex,
                       0x539);
          }
          (*local_c0->_vptr_DeathTest[5])(local_c0,2);
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception);
        }
LAB_0014e035:
        local_10c = 0;
      }
      testing::internal::scoped_ptr<testing::internal::DeathTest>::~scoped_ptr
                ((scoped_ptr<testing::internal::DeathTest> *)&gtest_sentinel);
      if (local_10c != 0) goto LAB_0014e071;
    }
    local_10c = 0;
  }
  else {
    local_10c = 2;
  }
LAB_0014e071:
  testing::internal::RE::~RE((RE *)&gtest_dt);
  if (local_10c == 0) {
    return;
  }
LAB_0014e0a3:
  testing::Message::Message(&local_118);
  message = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (&local_120,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Robbepop[P]state_ptr/testsrc/state_ptr_tests.cpp"
             ,0x3f,message);
  testing::internal::AssertHelper::operator=(&local_120,&local_118);
  testing::internal::AssertHelper::~AssertHelper(&local_120);
  testing::Message::~Message(&local_118);
  return;
}

Assistant:

TEST(StatePointer, SetStateOutOfBounds) {
	Foo foo;
	state_ptr<Foo> p{&foo, 0};
	ASSERT_DEATH(p.set_state(1337), "state value is out of bounds for this state_ptr");
}